

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filescan.cc
# Opt level: O2

RC __thiscall RM_FileScan::GetNumRecOnPage(RM_FileScan *this,PF_PageHandle *ph,int *numRecords)

{
  RC RVar1;
  RM_PageHeader *pageheader;
  char *bitmap;
  RM_PageHeader *local_18;
  char *local_10;
  
  RVar1 = RM_FileHandle::GetPageDataAndBitmap(this->fileHandle,ph,&local_10,&local_18);
  if (RVar1 == 0) {
    *numRecords = local_18->numRecords;
  }
  return RVar1;
}

Assistant:

RC RM_FileScan::GetNumRecOnPage(PF_PageHandle &ph, int &numRecords){
  RC rc;
  char *bitmap;
  struct RM_PageHeader *pageheader;
  if((rc = (this->fileHandle)->GetPageDataAndBitmap(ph, bitmap, pageheader)))
      return (rc);
  numRecords = pageheader->numRecords;
  return (0);
}